

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvsAdvDiff_FSA_non.c
# Opt level: O3

int f(sunrealtype t,N_Vector u,N_Vector udot,void *user_data)

{
  long lVar1;
  long lVar2;
  long lVar3;
  undefined1 auVar4 [16];
  double dVar5;
  double dVar6;
  
  lVar1 = N_VGetArrayPointer(t);
  lVar2 = N_VGetArrayPointer(udot);
  dVar5 = *(double *)((long)user_data + 8);
  auVar4._8_8_ = dVar5 * 2.0;
  auVar4._0_8_ = dVar5 * dVar5;
  auVar4 = divpd(**user_data,auVar4);
  lVar3 = 0;
  do {
    if (lVar3 == 0) {
      dVar5 = 0.0;
LAB_00102d91:
      dVar6 = *(double *)(lVar1 + 8 + lVar3);
    }
    else {
      dVar5 = *(double *)(lVar1 + -8 + lVar3);
      dVar6 = 0.0;
      if (lVar3 != 0x48) goto LAB_00102d91;
    }
    *(double *)(lVar2 + lVar3) =
         (dVar6 - dVar5) * auVar4._8_8_ +
         ((dVar5 - (*(double *)(lVar1 + lVar3) + *(double *)(lVar1 + lVar3))) + dVar6) *
         auVar4._0_8_;
    lVar3 = lVar3 + 8;
    if (lVar3 == 0x50) {
      return 0;
    }
  } while( true );
}

Assistant:

static int f(sunrealtype t, N_Vector u, N_Vector udot, void* user_data)
{
  sunrealtype ui, ult, urt, hordc, horac, hdiff, hadv;
  sunrealtype dx;
  sunrealtype *udata, *dudata;
  int i;
  UserData data;

  udata  = N_VGetArrayPointer(u);
  dudata = N_VGetArrayPointer(udot);

  /* Extract needed problem constants from data */
  data  = (UserData)user_data;
  dx    = data->dx;
  hordc = data->p[0] / (dx * dx);
  horac = data->p[1] / (SUN_RCONST(2.0) * dx);

  /* Loop over all grid points. */
  for (i = 0; i < NEQ; i++)
  {
    /* Extract u at x_i and two neighboring points */
    ui = udata[i];
    if (i != 0) { ult = udata[i - 1]; }
    else { ult = ZERO; }
    if (i != NEQ - 1) { urt = udata[i + 1]; }
    else { urt = ZERO; }

    /* Set diffusion and advection terms and load into udot */
    hdiff     = hordc * (ult - SUN_RCONST(2.0) * ui + urt);
    hadv      = horac * (urt - ult);
    dudata[i] = hdiff + hadv;
  }

  return (0);
}